

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

BadStatusOrAccess * __thiscall
absl::lts_20240722::BadStatusOrAccess::operator=(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  BadStatusOrAccess *other_local;
  BadStatusOrAccess *this_local;
  
  InitWhat(other);
  Status::operator=(&this->status_,&other->status_);
  std::__cxx11::string::operator=((string *)&this->what_,(string *)&other->what_);
  return this;
}

Assistant:

BadStatusOrAccess& BadStatusOrAccess::operator=(BadStatusOrAccess&& other) {
  // Ensure assignment is correct regardless of whether this->InitWhat() has
  // already been called.
  other.InitWhat();
  status_ = std::move(other.status_);
  what_ = std::move(other.what_);
  return *this;
}